

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Header.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::LE_Header::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,LE_Header *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Subprotocol:    ");
  poVar1 = std::operator<<(poVar1,(this->super_Header).super_Header6.m_ui8Padding1);
  poVar1 = std::operator<<(poVar1,"Live Entity ID: ");
  DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_EntID);
  std::operator<<(poVar1,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Header::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "Subprotocol:    " << m_ui8Padding1
       << "Live Entity ID: " << m_EntID.GetAsString();

    return ss.str();
}